

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O1

Error __thiscall
asmjit::v1_14::ZoneVector<asmjit::v1_14::RABlock_*>::append
          (ZoneVector<asmjit::v1_14::RABlock_*> *this,ZoneAllocator *allocator,RABlock **item)

{
  Error EVar1;
  
  if ((*(int *)(this + 8) != *(int *)(this + 0xc)) ||
     (EVar1 = ZoneVectorBase::_grow((ZoneVectorBase *)this,allocator,8,1), EVar1 == 0)) {
    *(RABlock **)(*(long *)this + (ulong)*(uint *)(this + 8) * 8) = *item;
    *(int *)(this + 8) = *(int *)(this + 8) + 1;
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

ASMJIT_FORCE_INLINE Error append(ZoneAllocator* allocator, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_size == _capacity))
      ASMJIT_PROPAGATE(grow(allocator, 1));

    memcpy(static_cast<void*>(static_cast<T*>(_data) + _size),
           static_cast<const void*>(&item),
           sizeof(T));

    _size++;
    return kErrorOk;
  }